

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Thread::Push(Thread *this,Ref ref)

{
  size_type sVar1;
  anon_union_16_6_113bff37_for_Value_0 local_30;
  value_type_conflict5 local_1c;
  Thread *local_18;
  Thread *this_local;
  Ref ref_local;
  
  local_18 = this;
  this_local = (Thread *)ref.index;
  sVar1 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                    (&this->values_);
  local_1c = (value_type_conflict5)sVar1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->refs_,&local_1c);
  local_30.v128_.v = (v128)Value::Make((Ref)this_local);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::push_back
            (&this->values_,(value_type *)&local_30.v128_);
  return;
}

Assistant:

void Thread::Push(Ref ref) {
  refs_.push_back(values_.size());
  values_.push_back(Value::Make(ref));
}